

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O0

bool spvtools::opt::analysis::anon_unknown_4::IsSubset(DecorationSet *a,DecorationSet *b)

{
  bool bVar1;
  reference pbVar2;
  reference pbVar3;
  bool local_59;
  _Self local_40;
  _Self local_38;
  _Self local_30;
  iterator it2;
  iterator it1;
  DecorationSet *b_local;
  DecorationSet *a_local;
  
  it2 = std::
        set<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
        ::begin(a);
  local_30._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
       ::begin(b);
  while( true ) {
    local_38._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
         ::end(a);
    bVar1 = std::operator!=(&it2,&local_38);
    if (!bVar1) {
      return true;
    }
    local_40._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
         ::end(b);
    bVar1 = std::operator==(&local_30,&local_40);
    local_59 = true;
    if (!bVar1) {
      pbVar2 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
               ::operator*(&it2);
      pbVar3 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
               ::operator*(&local_30);
      local_59 = std::operator<(pbVar2,pbVar3);
    }
    if (local_59 != false) break;
    pbVar2 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
             ::operator*(&it2);
    pbVar3 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
             ::operator*(&local_30);
    bVar1 = std::operator==(pbVar2,pbVar3);
    if (bVar1) {
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
      ::operator++(&it2,0);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
      ::operator++(&local_30,0);
    }
    else {
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
      ::operator++(&local_30,0);
    }
  }
  return false;
}

Assistant:

bool IsSubset(const DecorationSet& a, const DecorationSet& b) {
  auto it1 = a.begin();
  auto it2 = b.begin();

  while (it1 != a.end()) {
    if (it2 == b.end() || *it1 < *it2) {
      // |*it1| is in |a|, but not in |b|.
      return false;
    }
    if (*it1 == *it2) {
      // Found the element move to the next one.
      it1++;
      it2++;
    } else /* *it1 > *it2 */ {
      // Did not find |*it1| yet, check the next element in |b|.
      it2++;
    }
  }
  return true;
}